

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

bool __thiscall sensors_analytics::DefaultConsumer::Flush(DefaultConsumer *this)

{
  bool bVar1;
  int local_24;
  bool flush_result;
  LockGuard records_lock;
  DefaultConsumer *this_local;
  
  records_lock.mutex_ = (pthread_mutex_t *)this;
  LoadRecordFromDisk(this);
  while( true ) {
    LockGuard::LockGuard((LockGuard *)&stack0xffffffffffffffe0,&this->records_mutex_);
    bVar1 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->records_);
    if (bVar1) {
      local_24 = 3;
    }
    else {
      local_24 = 0;
    }
    LockGuard::~LockGuard((LockGuard *)&stack0xffffffffffffffe0);
    if (local_24 != 0) break;
    bVar1 = FlushPart(this,0x1e,false);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DefaultConsumer::Flush() {
  LoadRecordFromDisk();
  while (true) {
    {
      LockGuard records_lock(&records_mutex_);
      if (records_.empty()) {
        break;
      }
    }

    bool flush_result = FlushPart(kFlushAllBatchSize, false);
    if (!flush_result) {
      return false;
    }
  }
  return true;
}